

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowSize(GLFWwindow *handle,int width,int height)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    *(undefined4 *)(in_RDI + 0x28) = in_ESI;
    *(undefined4 *)(in_RDI + 0x2c) = in_EDX;
    _glfwPlatformSetWindowSize
              ((_GLFWwindow *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowSize(GLFWwindow* handle, int width, int height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT();

    window->videoMode.width  = width;
    window->videoMode.height = height;

    _glfwPlatformSetWindowSize(window, width, height);
}